

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_decompress.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined8 uVar2;
  uchar *puVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  size_t __n;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  char *local_160;
  iterator local_158;
  string local_150;
  byte local_129;
  WOFF2StringOut local_128 [7];
  bool ok;
  WOFF2StringOut out;
  allocator local_101;
  unsigned_long local_100;
  string local_f8 [8];
  string output;
  uint8_t *raw_input;
  undefined1 local_b0 [8];
  string input;
  undefined1 local_70 [8];
  string outfilename;
  allocator local_39;
  string local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  filename.field_2._8_8_ = argv;
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::__cxx11::string::find_last_of((char *)local_38,0x105039);
    std::__cxx11::string::substr((ulong)((long)&input.field_2 + 8),(ulong)local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input.field_2 + 8),".ttf");
    std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&raw_input,local_38);
    woff2::GetFileContent((string *)local_b0,(string *)&raw_input);
    std::__cxx11::string::~string((string *)&raw_input);
    puVar3 = (uchar *)std::__cxx11::string::data();
    output.field_2._8_8_ = puVar3;
    uVar4 = std::__cxx11::string::size();
    local_100 = woff2::ComputeWOFF2FinalSize(puVar3,uVar4);
    puVar5 = std::min<unsigned_long>(&local_100,&woff2::kDefaultMaxSize);
    uVar4 = *puVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,uVar4,'\0',&local_101);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    woff2::WOFF2StringOut::WOFF2StringOut(local_128,local_f8);
    uVar2 = output.field_2._8_8_;
    uVar4 = std::__cxx11::string::size();
    local_129 = woff2::ConvertWOFF2ToTTF((uchar *)uVar2,uVar4,(WOFF2Out *)local_128);
    local_129 = local_129 & 1;
    if (local_129 != 0) {
      std::__cxx11::string::string((string *)&local_150,(string *)local_70);
      local_158._M_current = (char *)std::__cxx11::string::begin();
      local_168._M_current = (char *)std::__cxx11::string::begin();
      __n = woff2::WOFF2StringOut::Size(local_128);
      local_160 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+(&local_168,__n);
      woff2::SetFileContents(&local_150,local_158,(iterator)local_160);
      std::__cxx11::string::~string((string *)&local_150);
    }
    argv_local._4_4_ = (uint)((local_129 & 1) == 0);
    woff2::WOFF2StringOut::~WOFF2StringOut(local_128);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    fprintf(_stderr,"One argument, the input filename, must be provided.\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  using std::string;

  if (argc != 2) {
    fprintf(stderr, "One argument, the input filename, must be provided.\n");
    return 1;
  }

  string filename(argv[1]);
  string outfilename = filename.substr(0, filename.find_last_of(".")) + ".ttf";

  // Note: update woff2_dec_fuzzer_new_entry.cc if this pattern changes.
  string input = woff2::GetFileContent(filename);
  const uint8_t* raw_input = reinterpret_cast<const uint8_t*>(input.data());
  string output(std::min(woff2::ComputeWOFF2FinalSize(raw_input, input.size()),
                         woff2::kDefaultMaxSize), 0);
  woff2::WOFF2StringOut out(&output);

  const bool ok = woff2::ConvertWOFF2ToTTF(raw_input, input.size(), &out);

  if (ok) {
    woff2::SetFileContents(outfilename, output.begin(),
        output.begin() + out.Size());
  }
  return ok ? 0 : 1;
}